

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O2

void reap_worker(void *unused)

{
  nni_cb p_Var1;
  size_t sVar2;
  nni_reap_node *pnVar3;
  bool bVar4;
  nni_reap_node *pnVar5;
  nni_reap_list **ppnVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = false;
  nni_thr_set_name((nni_thr *)0x0,"nng:reap2");
  nni_mtx_lock(&reap_mtx);
  while( true ) {
    ppnVar6 = &reap_list;
    bVar4 = bVar7;
    do {
      while( true ) {
        bVar8 = bVar4;
        ppnVar6 = &((nni_reap_list *)ppnVar6)->rl_next->rl_next;
        bVar7 = (nni_reap_list *)ppnVar6 != (nni_reap_list *)0x0;
        if ((nni_reap_list *)ppnVar6 == (nni_reap_list *)0x0) break;
        pnVar5 = ((nni_reap_list *)ppnVar6)->rl_nodes;
        bVar4 = bVar8;
        if (pnVar5 != (nni_reap_node *)0x0) {
          p_Var1 = ((nni_reap_list *)ppnVar6)->rl_func;
          ((nni_reap_list *)ppnVar6)->rl_nodes = (nni_reap_node *)0x0;
          sVar2 = ((nni_reap_list *)ppnVar6)->rl_offset;
          nni_mtx_unlock(&reap_mtx);
          while (pnVar5 != (nni_reap_node *)0x0) {
            pnVar3 = pnVar5->rn_next;
            (*p_Var1)((void *)((long)pnVar5 - sVar2));
            pnVar5 = pnVar3;
          }
          nni_mtx_lock(&reap_mtx);
          bVar4 = bVar7;
        }
      }
      ppnVar6 = &reap_list;
      bVar4 = bVar7;
    } while (bVar8);
    reap_empty = 1;
    nni_cv_wake(&reap_empty_cv);
    if (reap_exit != '\0') break;
    nni_cv_wait(&reap_work_cv);
  }
  nni_mtx_unlock(&reap_mtx);
  return;
}

Assistant:

static void
reap_worker(void *unused)
{
	NNI_ARG_UNUSED(unused);
	nni_thr_set_name(NULL, "nng:reap2");

	nni_mtx_lock(&reap_mtx);
	for (;;) {
		nni_reap_list *list;
		bool           reaped = false;

		for (list = reap_list; list != NULL; list = list->rl_next) {
			nni_reap_node *node;
			size_t         offset;
			nni_cb         func;

			if ((node = list->rl_nodes) == NULL) {
				continue;
			}

			reaped         = true;
			offset         = list->rl_offset;
			func           = list->rl_func;
			list->rl_nodes = NULL;

			// We process our list of nodes while not holding
			// the lock.
			nni_mtx_unlock(&reap_mtx);
			while (node != NULL) {
				void *ptr;
				ptr  = ((char *) node) - offset;
				node = node->rn_next;
				func(ptr);
			}
			nni_mtx_lock(&reap_mtx);
		}
		if (!reaped) {
			reap_empty = true;
			nni_cv_wake(&reap_empty_cv);
			if (reap_exit) {
				nni_mtx_unlock(&reap_mtx);
				return;
			}
			nni_cv_wait(&reap_work_cv);
		}
	}
}